

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.cpp
# Opt level: O2

void __thiscall cppgenerate::Method::Method(Method *this)

{
  allocator local_21;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->m_returnType,"void",&local_21);
  (this->m_documentation)._M_dataplus._M_p = (pointer)&(this->m_documentation).field_2;
  (this->m_documentation)._M_string_length = 0;
  (this->m_documentation).field_2._M_local_buf[0] = '\0';
  (this->m_arguments).
  super__Vector_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_arguments).
  super__Vector_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_arguments).
  super__Vector_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CodeBlock::CodeBlock(&this->m_code);
  this->m_access = PRIVATE;
  this->m_isStatic = false;
  this->m_isVirtual = false;
  this->m_isPureVirtual = false;
  CodeBlock::setIndent(&this->m_code,4);
  return;
}

Assistant:

Method::Method() : 
    m_returnType( "void" ),
    m_access( cppgenerate::AccessModifier::PRIVATE ),
    m_isVirtual( false ),
    m_isPureVirtual( false ),
    m_isStatic( false ){
    m_code.setIndent( 4 );
}